

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

real __thiscall fasttext::Matrix::dotRow(Matrix *this,Vector *vec,int64_t i)

{
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [64];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x55,"real fasttext::Matrix::dotRow(const Vector &, int64_t)");
  }
  if (this->m_ <= i) {
    __assert_fail("i < m_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x56,"real fasttext::Matrix::dotRow(const Vector &, int64_t)");
  }
  lVar1 = this->n_;
  if (vec->m_ != lVar1) {
    __assert_fail("vec.m_ == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x57,"real fasttext::Matrix::dotRow(const Vector &, int64_t)");
  }
  if (lVar1 < 1) {
    auVar4 = ZEXT864(0);
  }
  else {
    auVar4 = ZEXT864(0);
    lVar3 = 0;
    do {
      auVar2 = vfmadd231ss_fma(auVar4._0_16_,ZEXT416((uint)this->data_[i * lVar1 + lVar3]),
                               ZEXT416((uint)vec->data_[lVar3]));
      auVar4 = ZEXT1664(auVar2);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  return auVar4._0_4_;
}

Assistant:

real Matrix::dotRow(const Vector& vec, int64_t i) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.m_ == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += data_[i * n_ + j] * vec.data_[j];
  }
  return d;
}